

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_Equals_Test<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Equals_Test<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  undefined1 uVar1;
  bool bVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  undefined1 uVar14;
  HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *this_00;
  int *count;
  size_type in_RDI;
  AssertionResult gtest_ar__12;
  int i_1;
  int i;
  AssertionResult gtest_ar__11;
  AssertionResult gtest_ar__10;
  AssertionResult gtest_ar__9;
  AssertionResult gtest_ar__8;
  AssertionResult gtest_ar__7;
  TypeParam ht3;
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL> alloc;
  hasher hasher;
  AssertionResult gtest_ar__6;
  AssertionResult gtest_ar__5;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  TypeParam ht2;
  TypeParam ht1;
  undefined7 in_stack_fffffffffffff7e8;
  undefined1 in_stack_fffffffffffff7ef;
  undefined1 in_stack_fffffffffffff7f0;
  undefined1 in_stack_fffffffffffff7f1;
  undefined1 in_stack_fffffffffffff7f2;
  undefined1 in_stack_fffffffffffff7f3;
  undefined1 in_stack_fffffffffffff7f4;
  undefined1 in_stack_fffffffffffff7f5;
  undefined1 in_stack_fffffffffffff7f6;
  undefined1 in_stack_fffffffffffff7f7;
  key_equal *in_stack_fffffffffffff7f8;
  undefined4 in_stack_fffffffffffff800;
  undefined1 in_stack_fffffffffffff804;
  undefined1 in_stack_fffffffffffff805;
  undefined1 in_stack_fffffffffffff806;
  undefined1 in_stack_fffffffffffff807;
  int line;
  undefined4 in_stack_fffffffffffff810;
  uint i_00;
  Type type;
  Hasher *this_01;
  string local_7c8 [24];
  char *in_stack_fffffffffffff850;
  char *in_stack_fffffffffffff858;
  char *in_stack_fffffffffffff860;
  undefined7 in_stack_fffffffffffff868;
  undefined1 in_stack_fffffffffffff86f;
  AssertHelper *in_stack_fffffffffffff870;
  int local_714;
  value_type *in_stack_fffffffffffff928;
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff930;
  int local_6a4;
  string local_6a0 [55];
  undefined1 local_669;
  AssertionResult local_668 [7];
  string local_5f0 [55];
  byte local_5b9;
  AssertionResult local_5b8;
  string local_5a8 [55];
  undefined1 local_571;
  AssertionResult local_570 [7];
  string local_4f8 [55];
  byte local_4c1;
  AssertionResult local_4c0;
  string local_4b0 [55];
  undefined1 local_479;
  AssertionResult local_478 [11];
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL> local_3c8;
  Hasher local_3b4;
  string local_3a8 [55];
  undefined1 local_371;
  AssertionResult local_370;
  string local_360 [55];
  byte local_329;
  AssertionResult local_328;
  string local_318 [55];
  undefined1 local_2e1;
  AssertionResult local_2e0;
  HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *local_2d0;
  string local_2c8 [55];
  byte local_291;
  AssertionResult local_290;
  string local_280 [55];
  undefined1 local_249;
  AssertionResult local_248;
  string local_238 [55];
  byte local_201;
  AssertionResult local_200;
  string local_1f0 [55];
  undefined1 local_1b9;
  AssertionResult local_1b8;
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL> local_1a8;
  Hasher local_198;
  Hasher local_18c [15];
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL> local_d0;
  Hasher local_c0;
  Hasher local_b4 [15];
  
  this_01 = local_b4;
  i_00 = 0;
  Hasher::Hasher(this_01,0);
  Hasher::Hasher(&local_c0,i_00);
  count = (int *)(ulong)i_00;
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>::Alloc(&local_d0,i_00,count);
  google::
  HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashMap
            ((HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)CONCAT44(i_00,in_stack_fffffffffffff810),in_RDI,
             (hasher *)
             CONCAT17(in_stack_fffffffffffff807,
                      CONCAT16(in_stack_fffffffffffff806,
                               CONCAT15(in_stack_fffffffffffff805,
                                        CONCAT14(in_stack_fffffffffffff804,in_stack_fffffffffffff800
                                                )))),in_stack_fffffffffffff7f8,
             (allocator_type *)
             CONCAT17(in_stack_fffffffffffff7f7,
                      CONCAT16(in_stack_fffffffffffff7f6,
                               CONCAT15(in_stack_fffffffffffff7f5,
                                        CONCAT14(in_stack_fffffffffffff7f4,
                                                 CONCAT13(in_stack_fffffffffffff7f3,
                                                          CONCAT12(in_stack_fffffffffffff7f2,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffff7f1,
                                                  in_stack_fffffffffffff7f0))))))));
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_d0);
  Hasher::Hasher(local_18c,0);
  Hasher::Hasher(&local_198,0);
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>::Alloc(&local_1a8,0,(int *)0x0);
  google::
  HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashMap
            ((HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)CONCAT44(i_00,in_stack_fffffffffffff810),in_RDI,
             (hasher *)
             CONCAT17(in_stack_fffffffffffff807,
                      CONCAT16(in_stack_fffffffffffff806,
                               CONCAT15(in_stack_fffffffffffff805,
                                        CONCAT14(in_stack_fffffffffffff804,in_stack_fffffffffffff800
                                                )))),in_stack_fffffffffffff7f8,
             (allocator_type *)
             CONCAT17(in_stack_fffffffffffff7f7,
                      CONCAT16(in_stack_fffffffffffff7f6,
                               CONCAT15(in_stack_fffffffffffff7f5,
                                        CONCAT14(in_stack_fffffffffffff7f4,
                                                 CONCAT13(in_stack_fffffffffffff7f3,
                                                          CONCAT12(in_stack_fffffffffffff7f2,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffff7f1,
                                                  in_stack_fffffffffffff7f0))))))));
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_1a8);
  uVar1 = google::
          BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator==((BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT17(in_stack_fffffffffffff7f7,
                                   CONCAT16(in_stack_fffffffffffff7f6,
                                            CONCAT15(in_stack_fffffffffffff7f5,
                                                     CONCAT14(in_stack_fffffffffffff7f4,
                                                              CONCAT13(in_stack_fffffffffffff7f3,
                                                                       CONCAT12(
                                                  in_stack_fffffffffffff7f2,
                                                  CONCAT11(in_stack_fffffffffffff7f1,
                                                           in_stack_fffffffffffff7f0))))))),
                       (BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT17(in_stack_fffffffffffff7ef,in_stack_fffffffffffff7e8));
  local_1b9 = uVar1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_fffffffffffff7f7,
                      CONCAT16(in_stack_fffffffffffff7f6,
                               CONCAT15(in_stack_fffffffffffff7f5,
                                        CONCAT14(in_stack_fffffffffffff7f4,
                                                 CONCAT13(in_stack_fffffffffffff7f3,
                                                          CONCAT12(in_stack_fffffffffffff7f2,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffff7f1,
                                                  in_stack_fffffffffffff7f0))))))),
             (bool *)CONCAT17(in_stack_fffffffffffff7ef,in_stack_fffffffffffff7e8),(type *)0xef9fe0)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_1b8);
  if (!bVar2) {
    testing::Message::Message((Message *)this_01);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868),
               in_stack_fffffffffffff860,in_stack_fffffffffffff858,in_stack_fffffffffffff850);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_01,(Type)((ulong)count >> 0x20),
               (char *)CONCAT44(i_00,in_stack_fffffffffffff810),(int)(in_RDI >> 0x20),
               (char *)CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffff806,
                                               CONCAT15(in_stack_fffffffffffff805,
                                                        CONCAT14(in_stack_fffffffffffff804,
                                                                 in_stack_fffffffffffff800)))));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff870,
               (Message *)CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               CONCAT17(in_stack_fffffffffffff7f7,
                        CONCAT16(in_stack_fffffffffffff7f6,
                                 CONCAT15(in_stack_fffffffffffff7f5,
                                          CONCAT14(in_stack_fffffffffffff7f4,
                                                   CONCAT13(in_stack_fffffffffffff7f3,
                                                            CONCAT12(in_stack_fffffffffffff7f2,
                                                                     CONCAT11(
                                                  in_stack_fffffffffffff7f1,
                                                  in_stack_fffffffffffff7f0))))))));
    std::__cxx11::string::~string(local_1f0);
    testing::Message::~Message((Message *)0xefa124);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xefa1b8);
  uVar3 = google::
          BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator!=((BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT17(in_stack_fffffffffffff7f7,
                                   CONCAT16(in_stack_fffffffffffff7f6,
                                            CONCAT15(in_stack_fffffffffffff7f5,
                                                     CONCAT14(in_stack_fffffffffffff7f4,
                                                              CONCAT13(in_stack_fffffffffffff7f3,
                                                                       CONCAT12(
                                                  in_stack_fffffffffffff7f2,
                                                  CONCAT11(in_stack_fffffffffffff7f1,
                                                           in_stack_fffffffffffff7f0))))))),
                       (BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT17(in_stack_fffffffffffff7ef,in_stack_fffffffffffff7e8));
  local_201 = ~uVar3 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_fffffffffffff7f7,
                      CONCAT16(in_stack_fffffffffffff7f6,
                               CONCAT15(in_stack_fffffffffffff7f5,
                                        CONCAT14(in_stack_fffffffffffff7f4,
                                                 CONCAT13(in_stack_fffffffffffff7f3,
                                                          CONCAT12(in_stack_fffffffffffff7f2,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffff7f1,
                                                  in_stack_fffffffffffff7f0))))))),
             (bool *)CONCAT17(in_stack_fffffffffffff7ef,in_stack_fffffffffffff7e8),(type *)0xefa1f6)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_200);
  if (!bVar2) {
    testing::Message::Message((Message *)this_01);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868),
               in_stack_fffffffffffff860,in_stack_fffffffffffff858,in_stack_fffffffffffff850);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_01,(Type)((ulong)count >> 0x20),
               (char *)CONCAT44(i_00,in_stack_fffffffffffff810),(int)(in_RDI >> 0x20),
               (char *)CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(in_stack_fffffffffffff805,
                                                              CONCAT14(in_stack_fffffffffffff804,
                                                                       in_stack_fffffffffffff800))))
              );
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff870,
               (Message *)CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               CONCAT17(in_stack_fffffffffffff7f7,
                        CONCAT16(in_stack_fffffffffffff7f6,
                                 CONCAT15(in_stack_fffffffffffff7f5,
                                          CONCAT14(in_stack_fffffffffffff7f4,
                                                   CONCAT13(in_stack_fffffffffffff7f3,
                                                            CONCAT12(in_stack_fffffffffffff7f2,
                                                                     CONCAT11(
                                                  in_stack_fffffffffffff7f1,
                                                  in_stack_fffffffffffff7f0))))))));
    std::__cxx11::string::~string(local_238);
    testing::Message::~Message((Message *)0xefa2cb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xefa35f);
  uVar4 = google::
          BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator==((BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT17(in_stack_fffffffffffff7f7,
                                   CONCAT16(in_stack_fffffffffffff7f6,
                                            CONCAT15(in_stack_fffffffffffff7f5,
                                                     CONCAT14(in_stack_fffffffffffff7f4,
                                                              CONCAT13(in_stack_fffffffffffff7f3,
                                                                       CONCAT12(
                                                  in_stack_fffffffffffff7f2,
                                                  CONCAT11(in_stack_fffffffffffff7f1,
                                                           in_stack_fffffffffffff7f0))))))),
                       (BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT17(in_stack_fffffffffffff7ef,in_stack_fffffffffffff7e8));
  local_249 = uVar4;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_fffffffffffff7f7,
                      CONCAT16(in_stack_fffffffffffff7f6,
                               CONCAT15(in_stack_fffffffffffff7f5,
                                        CONCAT14(in_stack_fffffffffffff7f4,
                                                 CONCAT13(in_stack_fffffffffffff7f3,
                                                          CONCAT12(in_stack_fffffffffffff7f2,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffff7f1,
                                                  in_stack_fffffffffffff7f0))))))),
             (bool *)CONCAT17(in_stack_fffffffffffff7ef,in_stack_fffffffffffff7e8),(type *)0xefa3a0)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_248);
  if (!bVar2) {
    testing::Message::Message((Message *)this_01);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868),
               in_stack_fffffffffffff860,in_stack_fffffffffffff858,in_stack_fffffffffffff850);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_01,(Type)((ulong)count >> 0x20),
               (char *)CONCAT44(i_00,in_stack_fffffffffffff810),(int)(in_RDI >> 0x20),
               (char *)CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(
                                                  in_stack_fffffffffffff804,
                                                  in_stack_fffffffffffff800)))));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff870,
               (Message *)CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               CONCAT17(in_stack_fffffffffffff7f7,
                        CONCAT16(in_stack_fffffffffffff7f6,
                                 CONCAT15(in_stack_fffffffffffff7f5,
                                          CONCAT14(in_stack_fffffffffffff7f4,
                                                   CONCAT13(in_stack_fffffffffffff7f3,
                                                            CONCAT12(in_stack_fffffffffffff7f2,
                                                                     CONCAT11(
                                                  in_stack_fffffffffffff7f1,
                                                  in_stack_fffffffffffff7f0))))))));
    std::__cxx11::string::~string(local_280);
    testing::Message::~Message((Message *)0xefa475);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xefa509);
  uVar5 = google::
          BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator!=((BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT17(in_stack_fffffffffffff7f7,
                                   CONCAT16(in_stack_fffffffffffff7f6,
                                            CONCAT15(in_stack_fffffffffffff7f5,
                                                     CONCAT14(in_stack_fffffffffffff7f4,
                                                              CONCAT13(in_stack_fffffffffffff7f3,
                                                                       CONCAT12(
                                                  in_stack_fffffffffffff7f2,
                                                  CONCAT11(in_stack_fffffffffffff7f1,
                                                           in_stack_fffffffffffff7f0))))))),
                       (BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT17(in_stack_fffffffffffff7ef,in_stack_fffffffffffff7e8));
  local_291 = ~uVar5 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_fffffffffffff7f7,
                      CONCAT16(in_stack_fffffffffffff7f6,
                               CONCAT15(in_stack_fffffffffffff7f5,
                                        CONCAT14(in_stack_fffffffffffff7f4,
                                                 CONCAT13(in_stack_fffffffffffff7f3,
                                                          CONCAT12(in_stack_fffffffffffff7f2,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffff7f1,
                                                  in_stack_fffffffffffff7f0))))))),
             (bool *)CONCAT17(in_stack_fffffffffffff7ef,in_stack_fffffffffffff7e8),(type *)0xefa54c)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_290);
  if (!bVar2) {
    testing::Message::Message((Message *)this_01);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868),
               in_stack_fffffffffffff860,in_stack_fffffffffffff858,in_stack_fffffffffffff850);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_01,(Type)((ulong)count >> 0x20),
               (char *)CONCAT44(i_00,in_stack_fffffffffffff810),(int)(in_RDI >> 0x20),
               (char *)CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,
                                                  in_stack_fffffffffffff800)))));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff870,
               (Message *)CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               CONCAT17(in_stack_fffffffffffff7f7,
                        CONCAT16(in_stack_fffffffffffff7f6,
                                 CONCAT15(in_stack_fffffffffffff7f5,
                                          CONCAT14(in_stack_fffffffffffff7f4,
                                                   CONCAT13(in_stack_fffffffffffff7f3,
                                                            CONCAT12(in_stack_fffffffffffff7f2,
                                                                     CONCAT11(
                                                  in_stack_fffffffffffff7f1,
                                                  in_stack_fffffffffffff7f0))))))));
    std::__cxx11::string::~string(local_2c8);
    testing::Message::~Message((Message *)0xefa621);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xefa6b8);
  this_00 = (HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             *)HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(i_00,in_stack_fffffffffffff810),(int)(in_RDI >> 0x20));
  local_2d0 = this_00;
  google::
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key((BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                     *)CONCAT17(in_stack_fffffffffffff7f7,
                                CONCAT16(in_stack_fffffffffffff7f6,
                                         CONCAT15(in_stack_fffffffffffff7f5,
                                                  CONCAT14(in_stack_fffffffffffff7f4,
                                                           CONCAT13(in_stack_fffffffffffff7f3,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffff7f2,
                                                  CONCAT11(in_stack_fffffffffffff7f1,
                                                           in_stack_fffffffffffff7f0))))))),
                    (key_type *)CONCAT17(in_stack_fffffffffffff7ef,in_stack_fffffffffffff7e8));
  uVar6 = google::
          BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator==((BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT17(in_stack_fffffffffffff7f7,
                                   CONCAT16(in_stack_fffffffffffff7f6,
                                            CONCAT15(in_stack_fffffffffffff7f5,
                                                     CONCAT14(in_stack_fffffffffffff7f4,
                                                              CONCAT13(in_stack_fffffffffffff7f3,
                                                                       CONCAT12(
                                                  in_stack_fffffffffffff7f2,
                                                  CONCAT11(in_stack_fffffffffffff7f1,
                                                           in_stack_fffffffffffff7f0))))))),
                       (BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT17(in_stack_fffffffffffff7ef,in_stack_fffffffffffff7e8));
  local_2e1 = uVar6;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffff7f6,
                                     CONCAT15(in_stack_fffffffffffff7f5,
                                              CONCAT14(in_stack_fffffffffffff7f4,
                                                       CONCAT13(in_stack_fffffffffffff7f3,
                                                                CONCAT12(in_stack_fffffffffffff7f2,
                                                                         CONCAT11(
                                                  in_stack_fffffffffffff7f1,
                                                  in_stack_fffffffffffff7f0))))))),
             (bool *)CONCAT17(in_stack_fffffffffffff7ef,in_stack_fffffffffffff7e8),(type *)0xefa733)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_2e0);
  if (!bVar2) {
    testing::Message::Message((Message *)this_01);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868),
               in_stack_fffffffffffff860,in_stack_fffffffffffff858,in_stack_fffffffffffff850);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_01,(Type)((ulong)count >> 0x20),
               (char *)CONCAT44(i_00,in_stack_fffffffffffff810),(int)(in_RDI >> 0x20),
               (char *)CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,
                                                  in_stack_fffffffffffff800)))));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff870,
               (Message *)CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffff7f6,
                                       CONCAT15(in_stack_fffffffffffff7f5,
                                                CONCAT14(in_stack_fffffffffffff7f4,
                                                         CONCAT13(in_stack_fffffffffffff7f3,
                                                                  CONCAT12(in_stack_fffffffffffff7f2
                                                                           ,CONCAT11(
                                                  in_stack_fffffffffffff7f1,
                                                  in_stack_fffffffffffff7f0))))))));
    std::__cxx11::string::~string(local_318);
    testing::Message::~Message((Message *)0xefa808);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xefa89c);
  uVar7 = google::
          BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator!=((BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffff7f6,
                                                  CONCAT15(in_stack_fffffffffffff7f5,
                                                           CONCAT14(in_stack_fffffffffffff7f4,
                                                                    CONCAT13(
                                                  in_stack_fffffffffffff7f3,
                                                  CONCAT12(in_stack_fffffffffffff7f2,
                                                           CONCAT11(in_stack_fffffffffffff7f1,
                                                                    in_stack_fffffffffffff7f0)))))))
                       ,(BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT17(in_stack_fffffffffffff7ef,in_stack_fffffffffffff7e8));
  local_329 = ~uVar7 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(uVar6,CONCAT16(uVar7,CONCAT15(in_stack_fffffffffffff7f5,
                                                    CONCAT14(in_stack_fffffffffffff7f4,
                                                             CONCAT13(in_stack_fffffffffffff7f3,
                                                                      CONCAT12(
                                                  in_stack_fffffffffffff7f2,
                                                  CONCAT11(in_stack_fffffffffffff7f1,
                                                           in_stack_fffffffffffff7f0))))))),
             (bool *)CONCAT17(in_stack_fffffffffffff7ef,in_stack_fffffffffffff7e8),(type *)0xefa8df)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_328);
  if (!bVar2) {
    testing::Message::Message((Message *)this_01);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868),
               in_stack_fffffffffffff860,in_stack_fffffffffffff858,in_stack_fffffffffffff850);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_01,(Type)((ulong)count >> 0x20),
               (char *)CONCAT44(i_00,in_stack_fffffffffffff810),(int)(in_RDI >> 0x20),
               (char *)CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,
                                                  in_stack_fffffffffffff800)))));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff870,
               (Message *)CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               CONCAT17(uVar6,CONCAT16(uVar7,CONCAT15(in_stack_fffffffffffff7f5,
                                                      CONCAT14(in_stack_fffffffffffff7f4,
                                                               CONCAT13(in_stack_fffffffffffff7f3,
                                                                        CONCAT12(
                                                  in_stack_fffffffffffff7f2,
                                                  CONCAT11(in_stack_fffffffffffff7f1,
                                                           in_stack_fffffffffffff7f0))))))));
    std::__cxx11::string::~string(local_360);
    testing::Message::~Message((Message *)0xefa9b4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xefaa48);
  google::
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::resize((BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT17(uVar6,CONCAT16(uVar7,CONCAT15(in_stack_fffffffffffff7f5,
                                                     CONCAT14(in_stack_fffffffffffff7f4,
                                                              CONCAT13(in_stack_fffffffffffff7f3,
                                                                       CONCAT12(
                                                  in_stack_fffffffffffff7f2,
                                                  CONCAT11(in_stack_fffffffffffff7f1,
                                                           in_stack_fffffffffffff7f0))))))),
           CONCAT17(in_stack_fffffffffffff7ef,in_stack_fffffffffffff7e8));
  uVar8 = google::
          BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator==((BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT17(uVar6,CONCAT16(uVar7,CONCAT15(in_stack_fffffffffffff7f5,
                                                                 CONCAT14(in_stack_fffffffffffff7f4,
                                                                          CONCAT13(
                                                  in_stack_fffffffffffff7f3,
                                                  CONCAT12(in_stack_fffffffffffff7f2,
                                                           CONCAT11(in_stack_fffffffffffff7f1,
                                                                    in_stack_fffffffffffff7f0)))))))
                       ,(BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT17(in_stack_fffffffffffff7ef,in_stack_fffffffffffff7e8));
  local_371 = uVar8;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(uVar6,CONCAT16(uVar7,CONCAT15(uVar8,CONCAT14(in_stack_fffffffffffff7f4,
                                                                   CONCAT13(
                                                  in_stack_fffffffffffff7f3,
                                                  CONCAT12(in_stack_fffffffffffff7f2,
                                                           CONCAT11(in_stack_fffffffffffff7f1,
                                                                    in_stack_fffffffffffff7f0)))))))
             ,(bool *)CONCAT17(in_stack_fffffffffffff7ef,in_stack_fffffffffffff7e8),(type *)0xefaa9d
            );
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_370);
  if (!bVar2) {
    testing::Message::Message((Message *)this_01);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868),
               in_stack_fffffffffffff860,in_stack_fffffffffffff858,in_stack_fffffffffffff850);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_01,(Type)((ulong)count >> 0x20),
               (char *)CONCAT44(i_00,in_stack_fffffffffffff810),(int)(in_RDI >> 0x20),
               (char *)CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,
                                                  in_stack_fffffffffffff800)))));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff870,
               (Message *)CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               CONCAT17(uVar6,CONCAT16(uVar7,CONCAT15(uVar8,CONCAT14(in_stack_fffffffffffff7f4,
                                                                     CONCAT13(
                                                  in_stack_fffffffffffff7f3,
                                                  CONCAT12(in_stack_fffffffffffff7f2,
                                                           CONCAT11(in_stack_fffffffffffff7f1,
                                                                    in_stack_fffffffffffff7f0)))))))
              );
    std::__cxx11::string::~string(local_3a8);
    testing::Message::~Message((Message *)0xefab72);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xefac09);
  Hasher::Hasher(&local_3b4,1);
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>::Alloc(&local_3c8,2,(int *)0x0);
  google::
  HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashMap
            ((HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)CONCAT44(i_00,in_stack_fffffffffffff810),in_RDI,
             (hasher *)
             CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,in_stack_fffffffffffff800))
                                    )),(key_equal *)this_00,
             (allocator_type *)
             CONCAT17(uVar6,CONCAT16(uVar7,CONCAT15(uVar8,CONCAT14(in_stack_fffffffffffff7f4,
                                                                   CONCAT13(
                                                  in_stack_fffffffffffff7f3,
                                                  CONCAT12(in_stack_fffffffffffff7f2,
                                                           CONCAT11(in_stack_fffffffffffff7f1,
                                                                    in_stack_fffffffffffff7f0)))))))
            );
  uVar9 = google::
          BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator==((BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT17(uVar6,CONCAT16(uVar7,CONCAT15(uVar8,CONCAT14(
                                                  in_stack_fffffffffffff7f4,
                                                  CONCAT13(in_stack_fffffffffffff7f3,
                                                           CONCAT12(in_stack_fffffffffffff7f2,
                                                                    CONCAT11(
                                                  in_stack_fffffffffffff7f1,
                                                  in_stack_fffffffffffff7f0))))))),
                       (BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT17(in_stack_fffffffffffff7ef,in_stack_fffffffffffff7e8));
  local_479 = uVar9;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(uVar6,CONCAT16(uVar7,CONCAT15(uVar8,CONCAT14(uVar9,CONCAT13(
                                                  in_stack_fffffffffffff7f3,
                                                  CONCAT12(in_stack_fffffffffffff7f2,
                                                           CONCAT11(in_stack_fffffffffffff7f1,
                                                                    in_stack_fffffffffffff7f0)))))))
             ,(bool *)CONCAT17(in_stack_fffffffffffff7ef,in_stack_fffffffffffff7e8),(type *)0xefac9d
            );
  bVar2 = testing::AssertionResult::operator_cast_to_bool(local_478);
  if (!bVar2) {
    testing::Message::Message((Message *)this_01);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868),
               in_stack_fffffffffffff860,in_stack_fffffffffffff858,in_stack_fffffffffffff850);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_01,(Type)((ulong)count >> 0x20),
               (char *)CONCAT44(i_00,in_stack_fffffffffffff810),(int)(in_RDI >> 0x20),
               (char *)CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,
                                                  in_stack_fffffffffffff800)))));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff870,
               (Message *)CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               CONCAT17(uVar6,CONCAT16(uVar7,CONCAT15(uVar8,CONCAT14(uVar9,CONCAT13(
                                                  in_stack_fffffffffffff7f3,
                                                  CONCAT12(in_stack_fffffffffffff7f2,
                                                           CONCAT11(in_stack_fffffffffffff7f1,
                                                                    in_stack_fffffffffffff7f0)))))))
              );
    std::__cxx11::string::~string(local_4b0);
    testing::Message::~Message((Message *)0xefada4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xefae38);
  uVar10 = google::
           BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           ::operator!=((BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT17(uVar6,CONCAT16(uVar7,CONCAT15(uVar8,CONCAT14(uVar9,CONCAT13(
                                                  in_stack_fffffffffffff7f3,
                                                  CONCAT12(in_stack_fffffffffffff7f2,
                                                           CONCAT11(in_stack_fffffffffffff7f1,
                                                                    in_stack_fffffffffffff7f0)))))))
                        ,(BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                          *)CONCAT17(in_stack_fffffffffffff7ef,in_stack_fffffffffffff7e8));
  local_4c1 = ~uVar10 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(uVar6,CONCAT16(uVar7,CONCAT15(uVar8,CONCAT14(uVar9,CONCAT13(uVar10,CONCAT12(
                                                  in_stack_fffffffffffff7f2,
                                                  CONCAT11(in_stack_fffffffffffff7f1,
                                                           in_stack_fffffffffffff7f0))))))),
             (bool *)CONCAT17(in_stack_fffffffffffff7ef,in_stack_fffffffffffff7e8),(type *)0xefae7b)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_4c0);
  if (!bVar2) {
    testing::Message::Message((Message *)this_01);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868),
               in_stack_fffffffffffff860,in_stack_fffffffffffff858,in_stack_fffffffffffff850);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_01,(Type)((ulong)count >> 0x20),
               (char *)CONCAT44(i_00,in_stack_fffffffffffff810),(int)(in_RDI >> 0x20),
               (char *)CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,
                                                  in_stack_fffffffffffff800)))));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff870,
               (Message *)CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               CONCAT17(uVar6,CONCAT16(uVar7,CONCAT15(uVar8,CONCAT14(uVar9,CONCAT13(uVar10,CONCAT12(
                                                  in_stack_fffffffffffff7f2,
                                                  CONCAT11(in_stack_fffffffffffff7f1,
                                                           in_stack_fffffffffffff7f0))))))));
    std::__cxx11::string::~string(local_4f8);
    testing::Message::~Message((Message *)0xefaf50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xefafe7);
  HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueObject(this_00,CONCAT13(uVar6,CONCAT12(uVar7,CONCAT11(uVar8,uVar9))));
  google::
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffff930,in_stack_fffffffffffff928);
  std::pair<const_char_*const,_ValueType>::~pair((pair<const_char_*const,_ValueType> *)0xefb02c);
  uVar11 = google::
           BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           ::operator!=((BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT17(uVar6,CONCAT16(uVar7,CONCAT15(uVar8,CONCAT14(uVar9,CONCAT13(
                                                  uVar10,CONCAT12(in_stack_fffffffffffff7f2,
                                                                  CONCAT11(in_stack_fffffffffffff7f1
                                                                           ,
                                                  in_stack_fffffffffffff7f0))))))),
                        (BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT17(in_stack_fffffffffffff7ef,in_stack_fffffffffffff7e8));
  local_571 = uVar11;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(uVar6,CONCAT16(uVar7,CONCAT15(uVar8,CONCAT14(uVar9,CONCAT13(uVar10,CONCAT12(
                                                  uVar11,CONCAT11(in_stack_fffffffffffff7f1,
                                                                  in_stack_fffffffffffff7f0))))))),
             (bool *)CONCAT17(in_stack_fffffffffffff7ef,in_stack_fffffffffffff7e8),(type *)0xefb06d)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool(local_570);
  if (!bVar2) {
    testing::Message::Message((Message *)this_01);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868),
               in_stack_fffffffffffff860,in_stack_fffffffffffff858,in_stack_fffffffffffff850);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_01,(Type)((ulong)count >> 0x20),
               (char *)CONCAT44(i_00,in_stack_fffffffffffff810),(int)(in_RDI >> 0x20),
               (char *)CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,
                                                  in_stack_fffffffffffff800)))));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff870,
               (Message *)CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               CONCAT17(uVar6,CONCAT16(uVar7,CONCAT15(uVar8,CONCAT14(uVar9,CONCAT13(uVar10,CONCAT12(
                                                  uVar11,CONCAT11(in_stack_fffffffffffff7f1,
                                                                  in_stack_fffffffffffff7f0))))))));
    std::__cxx11::string::~string(local_5a8);
    testing::Message::~Message((Message *)0xefb168);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xefb1fc);
  uVar12 = google::
           BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           ::operator==((BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT17(uVar6,CONCAT16(uVar7,CONCAT15(uVar8,CONCAT14(uVar9,CONCAT13(
                                                  uVar10,CONCAT12(uVar11,CONCAT11(
                                                  in_stack_fffffffffffff7f1,
                                                  in_stack_fffffffffffff7f0))))))),
                        (BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT17(in_stack_fffffffffffff7ef,in_stack_fffffffffffff7e8));
  local_5b9 = ~uVar12 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(uVar6,CONCAT16(uVar7,CONCAT15(uVar8,CONCAT14(uVar9,CONCAT13(uVar10,CONCAT12(
                                                  uVar11,CONCAT11(uVar12,in_stack_fffffffffffff7f0))
                                                  ))))),
             (bool *)CONCAT17(in_stack_fffffffffffff7ef,in_stack_fffffffffffff7e8),(type *)0xefb23f)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_5b8);
  if (!bVar2) {
    testing::Message::Message((Message *)this_01);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868),
               in_stack_fffffffffffff860,in_stack_fffffffffffff858,in_stack_fffffffffffff850);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_01,(Type)((ulong)count >> 0x20),
               (char *)CONCAT44(i_00,in_stack_fffffffffffff810),(int)(in_RDI >> 0x20),
               (char *)CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,
                                                  in_stack_fffffffffffff800)))));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff870,
               (Message *)CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               CONCAT17(uVar6,CONCAT16(uVar7,CONCAT15(uVar8,CONCAT14(uVar9,CONCAT13(uVar10,CONCAT12(
                                                  uVar11,CONCAT11(uVar12,in_stack_fffffffffffff7f0))
                                                  ))))));
    std::__cxx11::string::~string(local_5f0);
    testing::Message::~Message((Message *)0xefb314);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xefb3ab);
  HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueObject(this_00,CONCAT13(uVar6,CONCAT12(uVar7,CONCAT11(uVar8,uVar9))));
  google::
  BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffff930,in_stack_fffffffffffff928);
  std::pair<const_char_*const,_ValueType>::~pair((pair<const_char_*const,_ValueType> *)0xefb3f0);
  uVar13 = google::
           BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           ::operator==((BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT17(uVar6,CONCAT16(uVar7,CONCAT15(uVar8,CONCAT14(uVar9,CONCAT13(
                                                  uVar10,CONCAT12(uVar11,CONCAT11(uVar12,
                                                  in_stack_fffffffffffff7f0))))))),
                        (BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT17(in_stack_fffffffffffff7ef,in_stack_fffffffffffff7e8));
  local_669 = uVar13;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(uVar6,CONCAT16(uVar7,CONCAT15(uVar8,CONCAT14(uVar9,CONCAT13(uVar10,CONCAT12(
                                                  uVar11,CONCAT11(uVar12,uVar13))))))),
             (bool *)CONCAT17(in_stack_fffffffffffff7ef,in_stack_fffffffffffff7e8),(type *)0xefb431)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool(local_668);
  if (!bVar2) {
    testing::Message::Message((Message *)this_01);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868),
               in_stack_fffffffffffff860,in_stack_fffffffffffff858,in_stack_fffffffffffff850);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_01,(Type)((ulong)count >> 0x20),
               (char *)CONCAT44(i_00,in_stack_fffffffffffff810),(int)(in_RDI >> 0x20),
               (char *)CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,
                                                  in_stack_fffffffffffff800)))));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff870,
               (Message *)CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               CONCAT17(uVar6,CONCAT16(uVar7,CONCAT15(uVar8,CONCAT14(uVar9,CONCAT13(uVar10,CONCAT12(
                                                  uVar11,CONCAT11(uVar12,uVar13))))))));
    std::__cxx11::string::~string(local_6a0);
    testing::Message::~Message((Message *)0xefb52c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xefb5c3);
  for (local_6a4 = 3; local_6a4 < 0x7d1; local_6a4 = local_6a4 + 1) {
    HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::UniqueObject(this_00,CONCAT13(uVar6,CONCAT12(uVar7,CONCAT11(uVar8,uVar9))));
    google::
    BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffff930,in_stack_fffffffffffff928);
    std::pair<const_char_*const,_ValueType>::~pair((pair<const_char_*const,_ValueType> *)0xefb626);
  }
  local_714 = 2000;
  while( true ) {
    type = (Type)((ulong)count >> 0x20);
    line = (int)(in_RDI >> 0x20);
    if (local_714 < 3) break;
    HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::UniqueObject(this_00,CONCAT13(uVar6,CONCAT12(uVar7,CONCAT11(uVar8,uVar9))));
    google::
    BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffff930,in_stack_fffffffffffff928);
    std::pair<const_char_*const,_ValueType>::~pair((pair<const_char_*const,_ValueType> *)0xefb6d1);
    local_714 = local_714 + -1;
  }
  uVar14 = google::
           BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           ::operator==((BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT17(uVar6,CONCAT16(uVar7,CONCAT15(uVar8,CONCAT14(uVar9,CONCAT13(
                                                  uVar10,CONCAT12(uVar11,CONCAT11(uVar12,uVar13)))))
                                                  )),
                        (BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT17(in_stack_fffffffffffff7ef,in_stack_fffffffffffff7e8));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(uVar6,CONCAT16(uVar7,CONCAT15(uVar8,CONCAT14(uVar9,CONCAT13(uVar10,CONCAT12(
                                                  uVar11,CONCAT11(uVar12,uVar13))))))),
             (bool *)CONCAT17(uVar14,in_stack_fffffffffffff7e8),(type *)0xefb74b);
  bVar2 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffff870);
  if (!bVar2) {
    testing::Message::Message((Message *)this_01);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)CONCAT17(uVar14,in_stack_fffffffffffff868),
               in_stack_fffffffffffff860,in_stack_fffffffffffff858,in_stack_fffffffffffff850);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_01,type,(char *)CONCAT44(i_00,in_stack_fffffffffffff810),line,
               (char *)CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,
                                                  in_stack_fffffffffffff800)))));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff870,(Message *)CONCAT17(uVar14,in_stack_fffffffffffff868));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               CONCAT17(uVar6,CONCAT16(uVar7,CONCAT15(uVar8,CONCAT14(uVar9,CONCAT13(uVar10,CONCAT12(
                                                  uVar11,CONCAT11(uVar12,uVar13))))))));
    std::__cxx11::string::~string(local_7c8);
    testing::Message::~Message((Message *)0xefb7f3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xefb87b);
  google::
  HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashMap
            ((HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)0xefb888);
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_3c8);
  google::
  HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashMap
            ((HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)0xefb8a2);
  google::
  HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashMap
            ((HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)0xefb8af);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Equals) {
  // The real test here is whether two hashtables are equal if they
  // have the same items but in a different order.
  TypeParam ht1;
  TypeParam ht2;

  EXPECT_TRUE(ht1 == ht1);
  EXPECT_FALSE(ht1 != ht1);
  EXPECT_TRUE(ht1 == ht2);
  EXPECT_FALSE(ht1 != ht2);
  ht1.set_deleted_key(this->UniqueKey(1));
  // Only the contents affect equality, not things like deleted-key.
  EXPECT_TRUE(ht1 == ht2);
  EXPECT_FALSE(ht1 != ht2);
  ht1.resize(2000);
  EXPECT_TRUE(ht1 == ht2);

  // The choice of allocator/etc doesn't matter either.
  typename TypeParam::hasher hasher(1);
  Alloc<typename TypeParam::key_type> alloc(2, NULL);
  TypeParam ht3(5, hasher, hasher, alloc);
  EXPECT_TRUE(ht1 == ht3);
  EXPECT_FALSE(ht1 != ht3);

  ht1.insert(this->UniqueObject(2));
  EXPECT_TRUE(ht1 != ht2);
  EXPECT_FALSE(ht1 == ht2);  // this should hold as well!

  ht2.insert(this->UniqueObject(2));
  EXPECT_TRUE(ht1 == ht2);

  for (int i = 3; i <= 2000; i++) {
    ht1.insert(this->UniqueObject(i));
  }
  for (int i = 2000; i >= 3; i--) {
    ht2.insert(this->UniqueObject(i));
  }
  EXPECT_TRUE(ht1 == ht2);
}